

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_revision.cpp
# Opt level: O1

void __thiscall
RevisionsFixture_InitOne4Two7_Test::~RevisionsFixture_InitOne4Two7_Test
          (RevisionsFixture_InitOne4Two7_Test *this)

{
  testing::Test::~Test((Test *)this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST_F (RevisionsFixture, InitOne4Two7) {
    constexpr auto r1 = revision_number{4};
    auto const r2 = just (revision_number{7});

    diff_dump::revisions_type const expected = this->expected_revisions (r2.value (), r1);
    diff_dump::revisions_type const actual =
        diff_dump::update_revisions (std::make_pair (r1, r2), db_head_revision);

    EXPECT_EQ (expected, actual);
}